

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::testAttachmentSize
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  deUint32 *pdVar4;
  VkFormat format;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkPhysicalDevice pVVar5;
  undefined8 uVar6;
  int width;
  undefined8 uVar7;
  int height;
  int iVar8;
  pointer pVVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int i_1;
  deUint32 queueFamilyIndex;
  deUint32 dVar14;
  int iVar15;
  VkPrimitiveTopology numLayers;
  int iVar16;
  ChannelOrder CVar17;
  VkResult result;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  VkPhysicalDeviceProperties *pVVar18;
  long lVar19;
  TextureFormat TVar20;
  long lVar21;
  long lVar22;
  const_iterator cVar23;
  deUint64 *pdVar24;
  OutOfMemoryError *this;
  NotSupportedError *this_00;
  long lVar25;
  undefined8 uVar26;
  undefined4 uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  VkPrimitiveTopology VVar31;
  long lVar32;
  deUint32 dVar33;
  uint uVar34;
  VkImageViewType VVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  VkDeviceSize VVar39;
  VkPipeline basePipeline;
  long lVar40;
  VkFormatProperties VVar41;
  undefined1 in_stack_fffffffffffff5f8;
  Vector<int,_4> local_9c8;
  VkFormat local_9ac;
  VkPhysicalDevice local_9a8;
  int local_99c;
  IVec4 checkSize;
  undefined8 local_988;
  int aiStack_980 [2];
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  VkBufferCreateInfo bufferCreateInfo_1;
  undefined4 local_870;
  uint auStack_86c [3];
  long local_860;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  Move<vk::Handle<(vk::HandleType)13>_> local_818;
  Move<vk::Handle<(vk::HandleType)18>_> local_7f8;
  Move<vk::Handle<(vk::HandleType)13>_> local_7d8;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  IVec4 checkOffset;
  VkImageSubresourceRange res_3;
  VkImageSubresourceRange res_2;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  ios_base local_3d0 [264];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  undefined1 local_290 [36];
  undefined8 local_26c;
  VkPrimitiveTopology local_264;
  undefined8 local_260;
  undefined8 uStack_258;
  deUint32 local_250;
  deUint32 *local_248;
  VkImageLayout local_240;
  deUint64 local_238;
  DeviceInterface *pDStack_230;
  VkDevice local_228;
  VkAllocationCallbacks *pVStack_220;
  deUint64 local_218;
  DeviceInterface *pDStack_210;
  VkDevice local_208;
  VkAllocationCallbacks *pVStack_200;
  deUint64 local_1f8;
  DeviceInterface *pDStack_1f0;
  VkDevice local_1e8;
  VkAllocationCallbacks *pVStack_1e0;
  deUint64 local_1d8;
  DeviceInterface *pDStack_1d0;
  VkDevice local_1c8;
  VkAllocationCallbacks *pVStack_1c0;
  VkDeviceSize vertexBufferOffset;
  int local_1b0 [6];
  void *local_198;
  undefined8 local_190;
  undefined8 local_188;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar2 = &(__return_storage_ptr__->m_description).field_2;
  local_99c = 0;
  vk = Context::getDeviceInterface(context);
  vk_00 = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  local_9a8 = Context::getPhysicalDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  local_9ac = caseDef->depthStencilFormat;
  ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,vk_00,local_9a8);
  if ((ulong)memoryProperties.memoryHeapCount == 0) {
    uVar37 = 0;
  }
  else {
    lVar25 = 0;
    uVar37 = 0;
    do {
      if (((*(byte *)((long)&memoryProperties.memoryHeaps[0].flags + lVar25) & 1) != 0) &&
         (uVar29 = *(ulong *)((long)&memoryProperties.memoryHeaps[0].size + lVar25),
         uVar37 <= uVar29)) {
        uVar37 = uVar29;
      }
      lVar25 = lVar25 + 0x10;
    } while ((ulong)memoryProperties.memoryHeapCount << 4 != lVar25);
    uVar37 = uVar37 >> 2;
  }
  pVVar18 = Context::getDeviceProperties(context);
  if (local_9ac == VK_FORMAT_UNDEFINED) {
    local_9c8.m_data[2] = (pVVar18->limits).maxImageDimension3D;
  }
  else {
    local_9c8.m_data[2] = (pVVar18->limits).maxImageDimension3D;
    dVar33 = (pVVar18->limits).maxImageArrayLayers;
    if ((int)dVar33 < local_9c8.m_data[2]) {
      local_9c8.m_data[2] = dVar33;
    }
  }
  dVar33 = (caseDef->imageSizeHint).m_data[0];
  if (dVar33 == 0xffffffff) {
    dVar33 = (pVVar18->limits).maxFramebufferWidth;
  }
  local_9c8.m_data[1] = (caseDef->imageSizeHint).m_data[1];
  if (local_9c8.m_data[1] == 0xffffffff) {
    local_9c8.m_data[1] = (pVVar18->limits).maxFramebufferHeight;
  }
  dVar14 = (caseDef->imageSizeHint).m_data[2];
  if (dVar14 != 0xffffffff) {
    local_9c8.m_data[2] = dVar14;
  }
  local_9c8.m_data[3] = (caseDef->imageSizeHint).m_data[3];
  if (local_9c8.m_data[3] == 0xffffffff) {
    local_9c8.m_data[3] = (pVVar18->limits).maxImageArrayLayers;
  }
  VVar35 = caseDef->viewType;
  switch(VVar35) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    local_9c8.m_data[0] = (pVVar18->limits).maxImageDimension1D;
    if ((int)dVar33 < local_9c8.m_data[0]) {
      local_9c8.m_data[0] = dVar33;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    dVar14 = (pVVar18->limits).maxImageDimension2D;
    goto LAB_004dc28c;
  case VK_IMAGE_VIEW_TYPE_3D:
    dVar14 = (pVVar18->limits).maxImageDimension3D;
LAB_004dc28c:
    if ((int)dVar14 <= (int)dVar33) {
      dVar33 = dVar14;
    }
    local_9c8.m_data[0] = dVar33;
    if ((int)dVar14 <= local_9c8.m_data[1]) {
      local_9c8.m_data[1] = dVar14;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    local_9c8.m_data[0] = (pVVar18->limits).maxImageDimensionCube;
    if ((int)dVar33 < local_9c8.m_data[0]) {
      local_9c8.m_data[0] = dVar33;
    }
    local_9c8.m_data[3] = (local_9c8.m_data[3] / 6) * 6;
    local_9c8.m_data[1] = local_9c8.m_data[0];
    break;
  default:
    local_9c8.m_data._0_8_ = (pointer)0x0;
    local_9c8.m_data[2] = 0;
    local_9c8.m_data[3] = 0;
    goto LAB_004dc2a9;
  }
LAB_004dc2a9:
  if (0 < local_99c) {
    iVar15 = 0;
    do {
      local_988 = (pointer)local_9c8.m_data._0_8_;
      pVVar9 = local_988;
      aiStack_980[0] = local_9c8.m_data[2];
      aiStack_980[1] = local_9c8.m_data[3];
      uVar28 = 1;
      local_988._0_4_ = local_9c8.m_data[0];
      uVar29 = 0;
      do {
        dVar33 = *(deUint32 *)((long)&local_988 + uVar28 * 4);
        if ((int)(deUint32)local_988 < (int)dVar33) {
          uVar29 = uVar28 & 0xffffffff;
          local_988._0_4_ = dVar33;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != 4);
      iVar16 = (int)uVar29;
      uVar36 = *(uint *)((long)&local_988 + (long)iVar16 * 4);
      uVar34 = (int)uVar36 >> 1;
      local_988 = pVVar9;
      if ((VVar35 == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) || (VVar35 == VK_IMAGE_VIEW_TYPE_CUBE)) {
        if (iVar16 < 2) {
          local_988 = (pointer)CONCAT44(uVar34,uVar34);
        }
        else if ((iVar16 == 3) && (5 < (int)uVar34)) {
          aiStack_980[0] = local_9c8.m_data[2];
          aiStack_980[1] = (uVar34 / 6) * 6;
        }
        else {
          local_988 = (pointer)0x0;
          aiStack_980[0] = 0;
          aiStack_980[1] = 0;
        }
      }
      else {
        *(uint *)((long)&local_988 + (long)iVar16 * 4) = uVar34;
      }
      if (uVar36 < 2) {
        local_988 = (pointer)0x0;
        aiStack_980[0] = 0;
        aiStack_980[1] = 0;
      }
      local_9c8.m_data._0_8_ = local_988;
      uVar6 = local_9c8.m_data._0_8_;
      local_9c8.m_data[2] = aiStack_980[0];
      local_9c8.m_data[3] = aiStack_980[1];
      memoryProperties.memoryTypeCount = 0;
      memoryProperties.memoryTypes[0].propertyFlags = 0;
      memoryProperties.memoryTypes[0].heapIndex = 0;
      memoryProperties.memoryTypes[1].propertyFlags = 0;
      local_9c8.m_data[0] = (int)local_988;
      local_9c8.m_data._0_8_ = uVar6;
      if (local_9c8.m_data[0] == 0) {
        uVar29 = 0xffffffffffffffff;
        do {
          if (uVar29 == 2) {
            uVar28 = 3;
            break;
          }
          lVar25 = uVar29 + 2;
          uVar28 = uVar29 + 1;
          pdVar4 = &memoryProperties.memoryTypes[0].heapIndex + uVar29;
          uVar29 = uVar28;
        } while (local_9c8.m_data[lVar25] == *pdVar4);
        if (2 < uVar28) {
          pdVar4 = &memoryProperties.memoryTypes[1].heapIndex;
          local_860 = 0x2b;
          memoryProperties._0_8_ = pdVar4;
          memoryProperties._0_8_ =
               std::__cxx11::string::_M_create((ulong *)&memoryProperties,(ulong)&local_860);
          memoryProperties.memoryTypes[1].heapIndex = (undefined4)local_860;
          memoryProperties.memoryTypes[2].propertyFlags = local_860._4_4_;
          builtin_strncpy((char *)memoryProperties._0_8_,
                          "Couldn\'t create an image with required size",0x2b);
          memoryProperties.memoryTypes[0].heapIndex = (undefined4)local_860;
          memoryProperties.memoryTypes[1].propertyFlags = local_860._4_4_;
          *(char *)(memoryProperties._0_8_ + local_860) = '\0';
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,memoryProperties._0_8_,
                     (char *)(memoryProperties._0_8_ + local_860));
          if ((deUint32 *)memoryProperties._0_8_ == pdVar4) {
            return __return_storage_ptr__;
          }
          operator_delete((void *)memoryProperties._0_8_,memoryProperties.memoryTypes._12_8_ + 1);
          return __return_storage_ptr__;
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != local_99c);
  }
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             "Using an image with size (width, height, depth, layers) = ",0x3a);
  tcu::operator<<((ostream *)
                  &vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_9c8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&vertices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::ios_base::~ios_base(local_3d0);
  lVar25 = (long)local_9c8.m_data[2];
  lVar30 = (long)local_9c8.m_data[3];
  numLayers = local_9c8.m_data[3];
  if (local_9c8.m_data[3] < local_9c8.m_data[2]) {
    numLayers = local_9c8.m_data[2];
  }
  lVar32 = (long)local_9c8.m_data[0];
  lVar19 = (long)local_9c8.m_data[1];
  TVar20 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar15 = tcu::getPixelSize(TVar20);
  if (local_9ac == VK_FORMAT_UNDEFINED) {
    lVar21 = 0;
  }
  else {
    lVar21 = (long)local_9c8.m_data[0];
    lVar38 = (long)local_9c8.m_data[1];
    lVar40 = (long)local_9c8.m_data[2];
    lVar22 = (long)local_9c8.m_data[3];
    TVar20 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
    iVar16 = tcu::getPixelSize(TVar20);
    lVar21 = (long)iVar16 * lVar40 * lVar22 * lVar38 * lVar21;
  }
  if ((local_9ac != VK_FORMAT_UNDEFINED) &&
     (VVar41 = ::vk::getPhysicalDeviceFormatProperties(vk_00,local_9a8,caseDef->depthStencilFormat),
     (VVar41._0_8_ >> 0x29 & 1) == 0)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Unsupported depth/stencil format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
               ,0x340);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((ulong)(lVar21 + lVar32 * lVar19 * lVar30 * lVar25 * (long)iVar15) <= uVar37) {
    memoryProperties.memoryTypeCount = 0x20;
    memoryProperties.memoryTypes[0].propertyFlags = 0x20;
    memoryProperties.memoryTypes[0].heapIndex = 8;
    memoryProperties.memoryTypes[1].propertyFlags = 8;
    checkSize.m_data[0] = 0;
    checkSize.m_data[1] = 0;
    checkSize.m_data[2] = 0;
    checkSize.m_data[3] = 0;
    lVar25 = 0;
    do {
      iVar15 = *(int *)((long)memoryProperties.memoryTypes + lVar25 * 4 + -4);
      if (local_9c8.m_data[lVar25] < iVar15) {
        iVar15 = local_9c8.m_data[lVar25];
      }
      checkSize.m_data[lVar25] = iVar15;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    lVar25 = 0;
    do {
      *(int *)((long)memoryProperties.memoryTypes + lVar25 * 4 + -4) =
           local_9c8.m_data[lVar25] - checkSize.m_data[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    checkOffset.m_data[0] = 0;
    checkOffset.m_data[1] = 0;
    checkOffset.m_data[2] = 0;
    checkOffset.m_data[3] = 0;
    lVar25 = 0;
    do {
      checkOffset.m_data[lVar25] =
           *(int *)((long)memoryProperties.memoryTypes + lVar25 * 4 + -4) / 2;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    lVar32 = (long)checkSize.m_data[0];
    lVar19 = (long)checkSize.m_data[1];
    lVar25 = (long)checkSize.m_data[2];
    lVar30 = (long)checkSize.m_data[3];
    TVar20 = ::vk::mapVkFormat(caseDef->colorFormat);
    iVar15 = tcu::getPixelSize(TVar20);
    VVar39 = (long)iVar15 * lVar25 * lVar30 * lVar19 * lVar32;
    makeBufferCreateInfo((VkBufferCreateInfo *)&vertexModule,VVar39,2);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&fragmentModule,vk,device,
                       (VkBufferCreateInfo *)&vertexModule,(VkAllocationCallbacks *)0x0);
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
               device,allocator,
               (VkBuffer)
               fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
               m_internal,(MemoryRequirement)0x1);
    uVar6 = memoryProperties._0_8_;
    memset(*(void **)(memoryProperties._0_8_ + 0x18),0,VVar39);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),*(VkDeviceSize *)(uVar6 + 0x10),
               0xffffffffffffffff);
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x74726576);
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)context->m_progCollection,(key_type *)&vertices);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,
               *(ProgramBinary **)(cVar23._M_node + 2),0);
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((vertices.
                                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->position)
                                    .m_data + 1));
    }
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x67617266);
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)context->m_progCollection,(key_type *)&vertices);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,
               *(ProgramBinary **)(cVar23._M_node + 2),0);
    fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((vertices.
                                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->position)
                                    .m_data + 1));
    }
    makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&memoryProperties,vk,device,
                   caseDef->colorFormat,caseDef->depthStencilFormat,numLayers,
                   VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_UNDEFINED);
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&memoryProperties,vk,device);
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pipelines.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colorAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depthStencilAttachments.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attachmentHandles.
    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    uVar37 = (ulong)caseDef->viewType;
    iVar16 = (uint)(uVar37 == 2) * 0x20;
    iVar15 = iVar16 + 0x10;
    if (uVar37 == 6) {
      iVar16 = iVar15;
    }
    if (uVar37 == 3) {
      iVar16 = iVar15;
    }
    uVar27 = 3;
    if (uVar37 < 7) {
      uVar27 = *(undefined4 *)(&DAT_00ae767c + uVar37 * 4);
    }
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ =
         caseDef->colorFormat;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0xe;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)CONCAT44(uVar27,iVar16);
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
         local_9c8.m_data[0];
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,
                      (VkImageCreateInfo *)&cmdPool,(VkAllocationCallbacks *)0x0);
    local_228 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_220 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_238._0_4_ = memoryProperties.memoryTypeCount;
    local_238._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_230 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = local_228;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVStack_220;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = local_238;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         pDStack_230;
    if (memoryProperties._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                 &memoryProperties.memoryTypes[0].heapIndex,(VkImage)memoryProperties._0_8_);
    }
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
              device,allocator,
              (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,(MemoryRequirement)0x0);
    uVar11 = memoryProperties._0_8_;
    if (local_9ac == VK_FORMAT_UNDEFINED) {
      local_9a8 = (VkPhysicalDevice)0x0;
    }
    else {
      local_290._24_4_ = caseDef->depthStencilFormat;
      local_290._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_290._8_8_ = (void *)0x0;
      local_290._16_4_ = 0;
      local_290._20_4_ = VK_IMAGE_TYPE_2D;
      local_290._28_4_ = local_9c8.m_data[0];
      local_290._32_4_ = local_9c8.m_data[1];
      local_26c._0_4_ = 1;
      local_26c._4_4_ = 1;
      local_260._0_4_ = VK_SAMPLE_COUNT_1_BIT;
      local_260._4_4_ = VK_IMAGE_TILING_OPTIMAL;
      uStack_258._0_4_ = 0x20;
      uStack_258._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_250 = 0;
      local_248 = (deUint32 *)0x0;
      local_240 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_264 = numLayers;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,
                        (VkImageCreateInfo *)local_290,(VkAllocationCallbacks *)0x0);
      local_208 = (VkDevice)memoryProperties.memoryTypes._12_8_;
      pVStack_200 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
      local_218._0_4_ = memoryProperties.memoryTypeCount;
      local_218._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
      pDStack_210 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
      memoryProperties.memoryTypeCount = 0;
      memoryProperties.memoryTypes[0].propertyFlags = 0;
      memoryProperties.memoryTypes[0].heapIndex = 0;
      memoryProperties.memoryTypes[1].propertyFlags = 0;
      memoryProperties.memoryTypes[1].heapIndex = 0;
      memoryProperties.memoryTypes[2].propertyFlags = 0;
      memoryProperties.memoryTypes[2].heapIndex = 0;
      memoryProperties.memoryTypes[3].propertyFlags = 0;
      if (depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
          != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                   (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                            object.m_internal);
      }
      depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           local_208;
      depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           pVStack_200;
      depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
           local_218;
      depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           pDStack_210;
      if (memoryProperties._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                   &memoryProperties.memoryTypes[0].heapIndex,(VkImage)memoryProperties._0_8_);
      }
      bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk
                ,device,allocator,
                (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,(MemoryRequirement)0x0);
      local_9a8 = (VkPhysicalDevice)memoryProperties._0_8_;
    }
    genFullQuadVertices(&vertices,numLayers);
    VVar39 = (long)vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)vertices.
                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    makeBufferCreateInfo(&bufferCreateInfo_1,VVar39,0x80);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&memoryProperties,vk,device,
                       &bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
    local_1e8 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_1e0 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_1f8._0_4_ = memoryProperties.memoryTypeCount;
    local_1f8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_1f0 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
                );
    }
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = local_1e8;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVStack_1e0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = local_1f8;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         pDStack_1f0;
    if (memoryProperties._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                 &memoryProperties.memoryTypes[0].heapIndex,(VkBuffer)memoryProperties._0_8_);
    }
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,vk,
               device,allocator,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (MemoryRequirement)0x1);
    uVar12 = memoryProperties._0_8_;
    memcpy(*(void **)(memoryProperties._0_8_ + 0x18),
           vertices.
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           ._M_impl.super__Vector_impl_data._M_start,VVar39);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar12 + 8),*(VkDeviceSize *)(uVar12 + 0x10),
               VVar39);
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (caseDef->depthStencilFormat == VK_FORMAT_UNDEFINED) {
      bVar13 = false;
      uVar36 = 0;
    }
    else {
      TVar20 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
      bVar13 = true;
      CVar17 = TVar20.order;
      if (CVar17 == DS) {
        uVar36 = 6;
      }
      else if (CVar17 == S) {
        uVar36 = 4;
      }
      else {
        if (CVar17 == D) {
          uVar36 = 2;
        }
        else {
          uVar36 = 1;
        }
        bVar13 = false;
      }
    }
    if (0 < (int)numLayers) {
      VVar31 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
      basePipeline.m_internal = 0;
      do {
        VVar35 = VK_IMAGE_VIEW_TYPE_LAST;
        if ((ulong)caseDef->viewType < 7) {
          VVar35 = *(VkImageViewType *)(&DAT_00ae7698 + (ulong)caseDef->viewType * 4);
        }
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.baseArrayLayer = VVar31;
        subresourceRange.layerCount = 1;
        makeImageView(&local_7d8,vk,device,
                      (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                               object.m_internal,VVar35,caseDef->colorFormat,subresourceRange);
        pdVar24 = (deUint64 *)operator_new(0x20);
        pdVar24[2] = (deUint64)
                     local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar24[3] = (deUint64)
                     local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar24 = local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar24[1] = (deUint64)
                     local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties._0_8_ = pdVar24;
        memoryProperties.memoryTypes._4_8_ = operator_new(0x20);
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 0;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 0;
        *(undefined ***)memoryProperties.memoryTypes._4_8_ = &PTR__SharedPtrState_00d1de90;
        *(deUint64 **)(memoryProperties.memoryTypes._4_8_ + 0x10) = pdVar24;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 1;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                    *)&colorAttachments,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   &memoryProperties);
        if (memoryProperties.memoryTypes._4_8_ != 0) {
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            memoryProperties.memoryTypeCount = 0;
            memoryProperties.memoryTypes[0].propertyFlags = 0;
            (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
          }
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (memoryProperties.memoryTypes._4_8_ != 0) {
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
            }
            memoryProperties.memoryTypes[0].heapIndex = 0;
            memoryProperties.memoryTypes[1].propertyFlags = 0;
          }
        }
        if (local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_7d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        if (attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
          ::_M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                    ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                      *)&attachmentHandles,
                     (iterator)
                     attachmentHandles.
                     super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (Handle<(vk::HandleType)13> *)
                     colorAttachments.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
        }
        else {
          (attachmentHandles.
           super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
               ((colorAttachments.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
               super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_9c8.m_data._0_8_;
        makeGraphicsPipeline
                  (&local_7f8,vk,device,basePipeline,
                   (VkPipelineLayout)
                   pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
                   m_internal,
                   (VkRenderPass)
                   renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                   m_internal,
                   (VkShaderModule)
                   vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
                   m_internal,
                   (VkShaderModule)
                   fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
                   m_internal,(IVec2 *)&vertices,VVar31,(uVar36 & 2) >> 1,bVar13,
                   (bool)in_stack_fffffffffffff5f8);
        pdVar24 = (deUint64 *)operator_new(0x20);
        pdVar24[2] = (deUint64)
                     local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_device;
        pdVar24[3] = (deUint64)
                     local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator;
        *pdVar24 = local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
        ;
        pdVar24[1] = (deUint64)
                     local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_deviceIface;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties._0_8_ = pdVar24;
        memoryProperties.memoryTypes._4_8_ = operator_new(0x20);
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 0;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 0;
        *(undefined ***)memoryProperties.memoryTypes._4_8_ = &PTR__SharedPtrState_00d1e0d0;
        *(deUint64 **)(memoryProperties.memoryTypes._4_8_ + 0x10) = pdVar24;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 1;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                    *)&pipelines,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                   &memoryProperties);
        if (memoryProperties.memoryTypes._4_8_ != 0) {
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            memoryProperties.memoryTypeCount = 0;
            memoryProperties.memoryTypes[0].propertyFlags = 0;
            (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
          }
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (memoryProperties.memoryTypes._4_8_ != 0) {
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
            }
            memoryProperties.memoryTypes[0].heapIndex = 0;
            memoryProperties.memoryTypes[1].propertyFlags = 0;
          }
        }
        if (local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    (&local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                     (VkPipeline)
                     local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                     m_internal);
        }
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
        local_7f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        basePipeline.m_internal =
             ((pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
        VVar31 = VVar31 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
      } while (numLayers != VVar31);
    }
    if (local_9ac != VK_FORMAT_UNDEFINED && 0 < (int)numLayers) {
      VVar31 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
      do {
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.aspectMask = uVar36;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.baseArrayLayer = VVar31;
        subresourceRange_00.layerCount = 1;
        makeImageView(&local_818,vk,device,
                      (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                      caseDef->depthStencilFormat,subresourceRange_00);
        pdVar24 = (deUint64 *)operator_new(0x20);
        pdVar24[2] = (deUint64)
                     local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar24[3] = (deUint64)
                     local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar24 = local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar24[1] = (deUint64)
                     local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties._0_8_ = pdVar24;
        memoryProperties.memoryTypes._4_8_ = operator_new(0x20);
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 0;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 0;
        *(undefined ***)memoryProperties.memoryTypes._4_8_ = &PTR__SharedPtrState_00d1de90;
        *(deUint64 **)(memoryProperties.memoryTypes._4_8_ + 0x10) = pdVar24;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 8) = 1;
        *(undefined4 *)(memoryProperties.memoryTypes._4_8_ + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                    *)&depthStencilAttachments,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                   &memoryProperties);
        if (memoryProperties.memoryTypes._4_8_ != 0) {
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 8);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            memoryProperties.memoryTypeCount = 0;
            memoryProperties.memoryTypes[0].propertyFlags = 0;
            (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 0x10))();
          }
          LOCK();
          piVar3 = (int *)(memoryProperties.memoryTypes._4_8_ + 0xc);
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (memoryProperties.memoryTypes._4_8_ != 0) {
              (**(code **)(*(long *)memoryProperties.memoryTypes._4_8_ + 8))();
            }
            memoryProperties.memoryTypes[0].heapIndex = 0;
            memoryProperties.memoryTypes[1].propertyFlags = 0;
          }
        }
        if (local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_818.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        if (attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
          ::_M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                    ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                      *)&attachmentHandles,
                     (iterator)
                     attachmentHandles.
                     super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (Handle<(vk::HandleType)13> *)
                     depthStencilAttachments.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
        }
        else {
          (attachmentHandles.
           super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
               ((depthStencilAttachments.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
               super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        VVar31 = VVar31 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
      } while (numLayers != VVar31);
    }
    makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&memoryProperties,vk,device,
                    (VkRenderPass)
                    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                    m_internal,
                    (deUint32)
                    ((ulong)((long)attachmentHandles.
                                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)attachmentHandles.
                                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,local_9c8.m_data[0],
                    local_9c8.m_data[1],1);
    local_1c8 = (VkDevice)memoryProperties.memoryTypes._12_8_;
    pVStack_1c0 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
    local_1d8._0_4_ = memoryProperties.memoryTypeCount;
    local_1d8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    pDStack_1d0 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    memoryProperties.memoryTypeCount = 0;
    memoryProperties.memoryTypes[0].propertyFlags = 0;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0;
    memoryProperties.memoryTypes[2].propertyFlags = 0;
    memoryProperties.memoryTypes[2].heapIndex = 0;
    memoryProperties.memoryTypes[3].propertyFlags = 0;
    if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
                 (VkFramebuffer)
                 framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
                );
    }
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = local_1c8;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
         pVStack_1c0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = local_1d8;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         pDStack_1d0;
    if (memoryProperties._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                 &memoryProperties.memoryTypes[0].heapIndex,(VkFramebuffer)memoryProperties._0_8_);
    }
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&memoryProperties,vk,device,2,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)memoryProperties.memoryTypes._12_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ =
         memoryProperties.memoryTypes[2].heapIndex;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
         memoryProperties.memoryTypes[3].propertyFlags;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ =
         memoryProperties.memoryTypeCount;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_ =
         memoryProperties.memoryTypes[0].propertyFlags;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&memoryProperties,vk,device,
                      (VkCommandPool)memoryProperties._0_8_);
    bufferCreateInfo_1.flags = memoryProperties.memoryTypes[1].heapIndex;
    bufferCreateInfo_1._20_4_ = memoryProperties.memoryTypes[2].propertyFlags;
    bufferCreateInfo_1.size._0_4_ = memoryProperties.memoryTypes[2].heapIndex;
    bufferCreateInfo_1.size._4_4_ = memoryProperties.memoryTypes[3].propertyFlags;
    bufferCreateInfo_1.sType = memoryProperties.memoryTypeCount;
    bufferCreateInfo_1._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
    bufferCreateInfo_1.pNext = (void *)memoryProperties.memoryTypes._4_8_;
    beginCommandBuffer(vk,(VkCommandBuffer)memoryProperties._0_8_);
    format = caseDef->colorFormat;
    bVar13 = ::vk::isUintFormat(format);
    uVar26._0_4_ = 0x7d;
    uVar26._4_4_ = 0x7d;
    if (!bVar13) {
      bVar13 = ::vk::isIntFormat(format);
      uVar26._0_4_ = 0x3f800000;
      uVar26._4_4_ = 0x3f800000;
      if (bVar13) {
        uVar26._0_4_ = 0x7d;
        uVar26._4_4_ = 0x7d;
      }
    }
    memoryProperties._0_8_ = uVar26;
    memoryProperties.memoryTypes._4_8_ = uVar26;
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
               (long)(int)numLayers,(value_type *)&memoryProperties,
               (allocator_type *)&vertexBufferOffset);
    if (local_9ac != VK_FORMAT_UNDEFINED) {
      memoryProperties.memoryTypeCount = 0x3f800000;
      memoryProperties.memoryTypes[0].propertyFlags = 0x2a;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::_M_fill_insert
                ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
                 (iterator)
                 vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(long)(int)numLayers,
                 (value_type *)&memoryProperties);
    }
    memoryProperties.memoryTypeCount = 0x2b;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex =
         (undefined4)
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    memoryProperties.memoryTypes[2].propertyFlags =
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_4_;
    memoryProperties.memoryTypes[2].heapIndex =
         (undefined4)
         framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
    memoryProperties.memoryTypes[3].propertyFlags =
         framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._4_4_;
    memoryProperties.memoryTypes[3].heapIndex = 0;
    memoryProperties.memoryTypes[4].propertyFlags = 0;
    memoryProperties.memoryTypes[4].heapIndex = local_9c8.m_data[0];
    memoryProperties.memoryTypes[5].propertyFlags = local_9c8.m_data[1];
    memoryProperties.memoryTypes[5].heapIndex =
         (deUint32)
         ((ulong)((long)vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
    memoryProperties.memoryTypes._52_8_ =
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start;
    vertexBufferOffset = 0;
    (*vk->_vptr_DeviceInterface[0x74])(vk,bufferCreateInfo_1._0_8_,&memoryProperties,0);
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,bufferCreateInfo_1._0_8_,0,1,&vertexBuffer,&vertexBufferOffset);
    if (vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (numLayers != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      uVar37 = 0;
      do {
        if (uVar37 != 0) {
          (*vk->_vptr_DeviceInterface[0x75])(vk,bufferCreateInfo_1._0_8_,0);
        }
        (*vk->_vptr_DeviceInterface[0x4c])
                  (vk,bufferCreateInfo_1._0_8_,0,
                   **(undefined8 **)
                     ((long)&(pipelines.
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar37 * 4));
        (*vk->_vptr_DeviceInterface[0x59])(vk,bufferCreateInfo_1._0_8_,4,1,uVar37 & 0xffffffff,0);
        uVar37 = uVar37 + 4;
      } while ((ulong)numLayers << 2 != uVar37);
    }
    (*vk->_vptr_DeviceInterface[0x76])(vk,bufferCreateInfo_1._0_8_);
    memoryProperties.memoryTypeCount = 0x2d;
    memoryProperties.memoryTypes[0].heapIndex = 0;
    memoryProperties.memoryTypes[1].propertyFlags = 0;
    memoryProperties.memoryTypes[1].heapIndex = 0x100;
    memoryProperties.memoryTypes[2].propertyFlags = 0x800;
    memoryProperties.memoryTypes[2].heapIndex = 2;
    memoryProperties.memoryTypes[3].propertyFlags = 6;
    memoryProperties.memoryTypes[3].heapIndex = 0xffffffff;
    memoryProperties.memoryTypes[4].propertyFlags = 0xffffffff;
    memoryProperties.memoryTypes[4].heapIndex =
         (undefined4)
         colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    memoryProperties.memoryTypes[5].propertyFlags =
         colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_;
    memoryProperties.memoryTypes[5].heapIndex = 1;
    memoryProperties.memoryTypes[6].propertyFlags = 0;
    memoryProperties.memoryTypes[6].heapIndex = 1;
    memoryProperties.memoryTypes[7].propertyFlags = 0;
    memoryProperties.memoryTypes[7].heapIndex = local_9c8.m_data[3];
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,bufferCreateInfo_1._0_8_,0x400,0x1000,0,0,0,0,0,1,(int)&memoryProperties);
    uVar26 = checkSize.m_data._0_8_;
    iVar16 = checkOffset.m_data[3];
    iVar15 = checkSize.m_data[3];
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
    iVar10 = checkOffset.m_data[2];
    width = checkSize.m_data[0];
    height = checkSize.m_data[1];
    iVar8 = checkSize.m_data[2];
    (*vk->_vptr_DeviceInterface[99])
              (vk,bufferCreateInfo_1._0_8_,
               colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
               colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,1,
               (int)&vertices);
    vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2c);
    local_1b0[0] = 0;
    local_1b0[1] = 0;
    local_1b0[2] = 0x1000;
    local_1b0[3] = 0x2000;
    local_1b0[4] = -1;
    local_1b0[5] = -1;
    local_198 = (void *)colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal;
    local_190 = 0;
    local_188 = 0xffffffffffffffff;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,bufferCreateInfo_1._0_8_,0x1000,0x4000,0,0,0,1,(int)&vertexBufferOffset,0,0);
    result = (*vk->_vptr_DeviceInterface[0x4a])(vk,bufferCreateInfo_1._0_8_);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                      ,0x410);
    submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)bufferCreateInfo_1._0_8_);
    if (bufferCreateInfo_1._0_8_ != 0) {
      memoryProperties.memoryTypeCount = bufferCreateInfo_1.sType;
      memoryProperties.memoryTypes[0].propertyFlags = bufferCreateInfo_1._4_4_;
      (**(code **)(*bufferCreateInfo_1.pNext + 0x240))
                (bufferCreateInfo_1.pNext,bufferCreateInfo_1._16_8_,bufferCreateInfo_1.size,1,
                 &memoryProperties);
    }
    if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkCommandPool)
                 cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
    ::vk::invalidateMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),*(VkDeviceSize *)(uVar6 + 0x10),
               0xffffffffffffffff);
    bufferCreateInfo_1._0_8_ = ::vk::mapVkFormat(caseDef->colorFormat);
    if (iVar15 < iVar8) {
      iVar15 = iVar8;
    }
    if (iVar16 < iVar10) {
      iVar16 = iVar10;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&memoryProperties,(TextureFormat *)&bufferCreateInfo_1,
               width,height,iVar15,*(void **)(uVar6 + 0x18));
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&vertices,(TextureFormat *)&bufferCreateInfo_1,width,height,iVar15);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&vertices)
    ;
    uVar7 = checkSize.m_data._0_8_;
    checkSize.m_data[0] = (int)uVar26;
    checkSize.m_data[1] = SUB84(uVar26,4);
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ =
         checkSize.m_data[0];
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_ =
         checkSize.m_data[1];
    checkSize.m_data._0_8_ = uVar7;
    generateExpectedImage((PixelBufferAccess *)&vertexBufferOffset,(IVec2 *)&cmdPool,iVar16);
    bVar13 = ::vk::isFloatFormat(caseDef->colorFormat);
    log = context->m_testCtx->m_log;
    if (bVar13) {
      lVar25 = 0;
      do {
        *(undefined4 *)
         ((long)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal +
         lVar25 * 4) = 0x3c23d70a;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      bVar13 = tcu::floatThresholdCompare
                         (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                          (ConstPixelBufferAccess *)&memoryProperties,(Vec4 *)&cmdPool,
                          COMPARE_LOG_RESULT);
    }
    else {
      lVar25 = 0;
      do {
        *(undefined4 *)
         ((long)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal +
         lVar25 * 4) = 2;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      bVar13 = tcu::intThresholdCompare
                         (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                          (ConstPixelBufferAccess *)&memoryProperties,(UVec4 *)&cmdPool,
                          COMPARE_LOG_RESULT);
    }
    if (bVar13 == false) {
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
           (deUint64)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device
      ;
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x4;
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)
           CONCAT35(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device.
                    _5_3_,0x6c696146);
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,
                 cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
                 (undefined1 *)
                 ((long)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                         m_device + 4));
      pVVar5 = local_9a8;
      if ((VkDevice *)
          cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
          &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device) {
        operator_delete((void *)cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object
                                .m_internal,
                        (ulong)(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                deleter.m_device + 1));
      }
    }
    else {
      local_870 = 0x73736150;
      auStack_86c[0] = auStack_86c[0] & 0xffffff00;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)psVar1,&local_870,auStack_86c);
      pVVar5 = local_9a8;
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertices);
    if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
                 (VkFramebuffer)
                 framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
                );
    }
    if (uVar12 != 0) {
      (**(code **)(*(long *)uVar12 + 8))();
    }
    if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
                );
    }
    if (attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)attachmentHandles.
                            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)attachmentHandles.
                            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&depthStencilAttachments);
    if (pVVar5 != (VkPhysicalDevice)0x0) {
      (**(code **)(*(long *)pVVar5 + 8))(pVVar5);
    }
    if (depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal !=
        0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                          object.m_internal);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector(&colorAttachments);
    if (uVar11 != 0) {
      (**(code **)(*(long *)uVar11 + 8))(uVar11);
    }
    if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&pipelines);
    if (pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0)
    {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
                 (VkPipelineLayout)
                 pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
                 m_internal);
    }
    if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkRenderPass)
                 renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal)
      ;
    }
    if (fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0)
    {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
                 m_internal);
    }
    if (vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
                 m_internal);
    }
    if (uVar6 != 0) {
      (**(code **)(*(long *)uVar6 + 8))(uVar6);
    }
    if (colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal)
      ;
    }
    return __return_storage_ptr__;
  }
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  memoryProperties._0_8_ = &memoryProperties.memoryTypes[1].heapIndex;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&memoryProperties,"Image size exceeds test\'s image memory budget","");
  ::vk::OutOfMemoryError::OutOfMemoryError
            (this,VK_ERROR_OUT_OF_DEVICE_MEMORY,(string *)&memoryProperties);
  __cxa_throw(this,&::vk::OutOfMemoryError::typeinfo,::vk::OutOfMemoryError::~OutOfMemoryError);
}

Assistant:

tcu::TestStatus testAttachmentSize (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	int sizeReductionIndex = 0;

	for (;;)
	{
		try
		{
			return testWithSizeReduction(context, caseDef, sizeReductionIndex);
		}
		catch (OutOfMemoryError& ex)
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "-- OutOfMemoryError: " << ex.getMessage() << tcu::TestLog::EndMessage;

			++sizeReductionIndex;
		}
	}
	// Never reached
}